

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void sort_data_ensure_sz(stagewise_poly *poly,size_t len)

{
  size_t sVar1;
  sort_data *psVar2;
  ulong in_RSI;
  undefined8 *in_RDI;
  size_t len_candidate;
  size_t in_stack_000001a8;
  ulong local_28;
  
  if ((ulong)in_RDI[4] < in_RSI) {
    local_28 = in_RSI << 1;
    sVar1 = vw::length((vw *)*in_RDI);
    if (sVar1 < local_28) {
      local_28 = vw::length((vw *)*in_RDI);
    }
    in_RDI[4] = local_28;
    free((void *)in_RDI[3]);
    psVar2 = calloc_or_throw<sort_data>(in_stack_000001a8);
    in_RDI[3] = psVar2;
  }
  return;
}

Assistant:

void sort_data_ensure_sz(stagewise_poly &poly, size_t len)
{
  if (poly.sd_len < len)
  {
    size_t len_candidate = 2 * len;
#ifdef DEBUG
    cout << "resizing sort buffer; current size " << poly.sd_len;
#endif  // DEBUG
    poly.sd_len = (len_candidate > poly.all->length()) ? poly.all->length() : len_candidate;
#ifdef DEBUG
    cout << ", new size " << poly.sd_len << endl;
#endif              // DEBUG
    free(poly.sd);  // okay for null.
    poly.sd = calloc_or_throw<sort_data>(poly.sd_len);
  }
  assert(len <= poly.sd_len);
}